

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

BOOL __thiscall LASquadtree::manage_cell(LASquadtree *this,U32 cell_index,BOOL finalize)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  U32 *ptr;
  U32 UVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  U32 *pUVar8;
  uint uVar9;
  uint uVar10;
  
  uVar9 = cell_index >> 5;
  uVar3 = this->adaptive_alloc;
  ptr = this->adaptive;
  if (uVar9 < uVar3) goto LAB_00123b88;
  if (ptr == (U32 *)0x0) {
    uVar10 = uVar9 + 1;
    ptr = (U32 *)malloc((ulong)(uVar9 * 4 + 4));
    this->adaptive = ptr;
    pUVar8 = ptr + uVar3;
    uVar3 = uVar9 - uVar3;
LAB_00123b70:
    memset(pUVar8,0,(ulong)uVar3 * 4 + 4);
  }
  else {
    uVar10 = uVar9 * 2;
    ptr = (U32 *)realloc_las(ptr,(ulong)(uVar9 * 8));
    this->adaptive = ptr;
    uVar3 = this->adaptive_alloc;
    if (uVar3 < uVar10) {
      pUVar8 = ptr + uVar3;
      uVar3 = ~uVar3 + uVar10;
      goto LAB_00123b70;
    }
  }
  this->adaptive_alloc = uVar10;
LAB_00123b88:
  ptr[uVar9] = ptr[uVar9] & ~(1 << ((byte)cell_index & 0x1f));
  uVar6 = 0;
  bVar2 = 0xfc;
  do {
    bVar1 = bVar2;
    uVar7 = uVar6;
    uVar6 = uVar7 + 1;
    bVar2 = bVar1 + 2;
  } while (this->level_offset[uVar7 + 1] <= cell_index);
  if (this->sub_level == 0) {
    UVar4 = this->level_offset[uVar7 & 0xffffffff];
  }
  else {
    UVar4 = (this->sub_level_index << (bVar1 + 4 & 0x1f)) +
            this->level_offset[(this->sub_level + (int)uVar6) - 1];
  }
  if (uVar6 != 1) {
    uVar7 = uVar7 - 1;
    uVar3 = cell_index - UVar4;
    pUVar8 = this->level_offset + (uVar7 & 0xffffffff);
    do {
      uVar3 = uVar3 >> 2;
      iVar5 = (int)uVar7;
      if (this->sub_level == 0) {
        uVar9 = *pUVar8 + uVar3;
      }
      else {
        uVar9 = (this->sub_level_index << (bVar2 & 0x1f)) + uVar3 +
                this->level_offset[this->sub_level + iVar5];
      }
      if ((ptr[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) {
        return true;
      }
      ptr[uVar9 >> 5] = 1 << ((byte)uVar9 & 0x1f) | ptr[uVar9 >> 5];
      pUVar8 = pUVar8 + -1;
      bVar2 = bVar2 - 2;
      uVar7 = (ulong)(iVar5 - 1);
    } while (iVar5 != 0);
  }
  return true;
}

Assistant:

BOOL LASquadtree::manage_cell(const U32 cell_index, const BOOL finalize)
{
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  if (adaptive_pos >= adaptive_alloc)
  {
    if (adaptive)
    {
      adaptive = (U32*)realloc_las(adaptive, adaptive_pos*2*sizeof(U32));
      for (U32 i = adaptive_alloc; i < adaptive_pos*2; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos*2;
    }
    else
    {
#pragma warning(push)
#pragma warning(disable : 6011)
      adaptive = (U32*)malloc((adaptive_pos+1)*sizeof(U32));
      for (U32 i = adaptive_alloc; i <= adaptive_pos; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos+1;
#pragma warning(pop)
    }
  }
  adaptive[adaptive_pos] &= ~adaptive_bit;
  U32 index;
  U32 level = get_level(cell_index);
  U32 level_index = get_level_index(cell_index, level);
  while (level)
  {
    level--;
    level_index = level_index >> 2;
    index = get_cell_index(level_index, level);
    adaptive_pos = index/32;
    adaptive_bit = ((U32)1) << (index%32);
    if (adaptive[adaptive_pos] & adaptive_bit) break;
    adaptive[adaptive_pos] |= adaptive_bit;
  }
  return TRUE;
}